

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.h
# Opt level: O0

bool __thiscall QueryResult::is_empty(QueryResult *this)

{
  long in_RDI;
  uint7 in_stack_fffffffffffffff0;
  bool bVar1;
  
  bVar1 = false;
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    bVar1 = SortedRun::empty((SortedRun *)(ulong)in_stack_fffffffffffffff0);
  }
  return bVar1;
}

Assistant:

bool is_empty() const { return !has_everything && results.empty(); }